

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O0

int __thiscall
CaDiCaL::Internal::elim_round(Internal *this,bool *completed,bool *deleted_binary_clause)

{
  Clause *this_00;
  long lVar1;
  int64_t iVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  int64_t *piVar7;
  int *piVar8;
  size_t sVar9;
  reference ppCVar10;
  Instantiator *pIVar11;
  Flags *pFVar12;
  uint uVar13;
  byte *in_RSI;
  time_t *__timer;
  Internal *in_RDI;
  double s;
  Internal *pIVar14;
  Internal *s_00;
  int L_1;
  double N_1;
  int units;
  int64_t resolutions;
  int eliminated;
  Instantiator instantiator;
  int idx_1;
  int64_t tried;
  int64_t garbage_limit;
  int old_fixed;
  int old_eliminated;
  int64_t old_resolutions;
  int *lit_2;
  literal_iterator __end3_1;
  literal_iterator __begin3_1;
  Clause *__range3_1;
  Clause **c_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1_2;
  int64_t scheduled;
  int idx;
  iterator __end1_1;
  iterator __begin1_1;
  Range *__range1_1;
  ElimSchedule *schedule;
  Eliminator eliminator;
  int *lit_1;
  literal_iterator __end3;
  literal_iterator __begin3;
  Clause *__range3;
  char tmp;
  int *lit;
  literal_iterator __end2;
  literal_iterator __begin2;
  Clause *__range2;
  bool falsified;
  bool satisfied;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1;
  int64_t delta;
  int64_t resolution_limit;
  int L;
  double N;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined2 in_stack_fffffffffffffca4;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  Internal *in_stack_fffffffffffffca8;
  Internal *pIVar15;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  Internal *in_stack_fffffffffffffcc0;
  char *pcVar16;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  uint uVar17;
  Eliminator *in_stack_fffffffffffffcd0;
  Internal *in_stack_fffffffffffffce0;
  bool *in_stack_fffffffffffffce8;
  Internal *in_stack_fffffffffffffcf0;
  Eliminator *in_stack_fffffffffffffcf8;
  Internal *in_stack_fffffffffffffd00;
  uint in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1c;
  undefined1 in_stack_fffffffffffffd1d;
  undefined1 in_stack_fffffffffffffd1e;
  byte bVar18;
  Internal *in_stack_fffffffffffffd20;
  Instantiator *in_stack_fffffffffffffd38;
  Internal *in_stack_fffffffffffffd40;
  long local_208;
  Instantiator *local_1d8;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_1b8;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_1b0;
  size_t local_1a8;
  int local_19c;
  iterator local_198 [5];
  iterator local_184;
  Range *local_180;
  undefined1 *local_178;
  undefined1 local_168 [184];
  literal_iterator local_b0;
  literal_iterator local_a8;
  literal_iterator local_a0;
  Clause *local_98;
  char local_89;
  int *local_88;
  int *local_80;
  int *local_78;
  Clause *local_70;
  byte local_62;
  byte local_61;
  reference local_60;
  Clause **local_58;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_50;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_48;
  long local_40;
  long local_38;
  long local_30;
  int local_24;
  double local_20;
  byte *local_10;
  
  local_10 = in_RSI;
  time(in_RDI,(time_t *)in_RSI);
  local_24 = (in_RDI->internal->opts).profile;
  local_20 = s;
  if (((in_RDI->preprocessing & 1U) == 0) && ((in_RDI->lookingahead & 1U) == 0)) {
    if (((in_RDI->stable & 1U) != 0) && ((in_RDI->internal->profiles).stable.level <= local_24)) {
      stop_profiling(in_RDI->internal,&(in_RDI->internal->profiles).stable,s);
    }
    if (((in_RDI->stable & 1U) == 0) && ((in_RDI->internal->profiles).unstable.level <= local_24)) {
      stop_profiling(in_RDI->internal,&(in_RDI->internal->profiles).unstable,local_20);
    }
    if ((in_RDI->internal->profiles).search.level <= local_24) {
      stop_profiling(in_RDI->internal,&(in_RDI->internal->profiles).search,local_20);
    }
    reset_mode(in_RDI,SEARCH);
  }
  if ((in_RDI->internal->profiles).simplify.level <= local_24) {
    start_profiling(in_RDI->internal,&(in_RDI->internal->profiles).simplify,local_20);
  }
  if ((in_RDI->internal->profiles).elim.level <= local_24) {
    start_profiling(in_RDI->internal,&(in_RDI->internal->profiles).elim,local_20);
  }
  set_mode(in_RDI,SIMPLIFY);
  set_mode(in_RDI,ELIM);
  (in_RDI->stats).elimrounds = (in_RDI->stats).elimrounds + 1;
  (in_RDI->last).elim.marked = (in_RDI->stats).mark.elim;
  if ((in_RDI->opts).elimlimited == 0) {
    if (in_RDI->internal != (Internal *)0x0) {
      phase(in_RDI->internal,"elim-round",(in_RDI->stats).elimrounds,"resolutions unlimited");
    }
    local_30 = 0x7fffffffffffffff;
  }
  else {
    local_38 = (long)((double)(in_RDI->stats).propagations.search *
                     (double)(in_RDI->opts).elimreleff * 0.001);
    if (local_38 < (in_RDI->opts).elimineff) {
      local_38 = (long)(in_RDI->opts).elimineff;
    }
    if ((in_RDI->opts).elimaxeff < local_38) {
      local_38 = (long)(in_RDI->opts).elimaxeff;
    }
    iVar5 = active(in_RDI);
    local_40 = (long)iVar5 << 1;
    plVar6 = std::max<long>(&local_38,&local_40);
    local_38 = *plVar6;
    if (in_RDI->internal != (Internal *)0x0) {
      phase(in_RDI->internal,"elim-round",(in_RDI->stats).elimrounds,"limit of %ld resolutions",
            local_38);
    }
    local_30 = (in_RDI->stats).elimres + local_38;
  }
  init_noccs((Internal *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,
                               CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
  local_48 = &in_RDI->clauses;
  local_50._M_current =
       (Clause **)
       std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                 ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_58 = (Clause **)
             std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                       ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                        CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffca7,
                                        CONCAT16(in_stack_fffffffffffffca6,
                                                 CONCAT24(in_stack_fffffffffffffca4,
                                                          in_stack_fffffffffffffca0))),
                            (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)), bVar4
        ) {
    local_60 = __gnu_cxx::
               __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
               ::operator*(&local_50);
    if (((*(uint *)&(*local_60)->field_0x8 >> 4 & 1) == 0) &&
       ((*(uint *)&(*local_60)->field_0x8 >> 0xb & 1) == 0)) {
      local_61 = 0;
      local_62 = 0;
      local_70 = *local_60;
      local_78 = Clause::begin(local_70);
      local_80 = Clause::end(local_70);
      for (; local_78 != local_80; local_78 = local_78 + 1) {
        local_88 = local_78;
        local_89 = val(in_RDI,*local_78);
        if (local_89 < '\x01') {
          if (local_89 < '\0') {
            local_62 = 1;
          }
        }
        else {
          local_61 = 1;
        }
      }
      if ((local_61 & 1) == 0) {
        local_98 = *local_60;
        local_a0 = Clause::begin(local_98);
        local_a8 = Clause::end(local_98);
        for (; local_a0 != local_a8; local_a0 = local_a0 + 1) {
          local_b0 = local_a0;
          bVar4 = active((Internal *)
                         CONCAT17(in_stack_fffffffffffffca7,
                                  CONCAT16(in_stack_fffffffffffffca6,
                                           CONCAT24(in_stack_fffffffffffffca4,
                                                    in_stack_fffffffffffffca0))),
                         in_stack_fffffffffffffc9c);
          if (bVar4) {
            if ((local_62 & 1) != 0) {
              mark_elim((Internal *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                        (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
            }
            piVar7 = noccs((Internal *)
                           CONCAT17(in_stack_fffffffffffffca7,
                                    CONCAT16(in_stack_fffffffffffffca6,
                                             CONCAT24(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0))),
                           in_stack_fffffffffffffc9c);
            *piVar7 = *piVar7 + 1;
          }
        }
      }
      else {
        mark_garbage((Internal *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                     (Clause *)in_stack_fffffffffffffca8);
      }
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_50);
  }
  init_occs(in_stack_fffffffffffffce0);
  Eliminator::Eliminator
            (in_stack_fffffffffffffcd0,
             (Internal *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  local_178 = local_168;
  local_180 = &in_RDI->vars;
  local_184 = Range::begin((Range *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_198[0] = Range::end((Range *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = CaDiCaL::operator!=(&local_184,local_198), bVar4) {
    piVar8 = Range::iterator::operator*(&local_184);
    local_19c = *piVar8;
    bVar4 = active((Internal *)
                   CONCAT17(in_stack_fffffffffffffca7,
                            CONCAT16(in_stack_fffffffffffffca6,
                                     CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)))
                   ,in_stack_fffffffffffffc9c);
    if (((bVar4) &&
        (bVar4 = frozen((Internal *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                        (int)((ulong)in_stack_fffffffffffffca8 >> 0x20)), !bVar4)) &&
       (pFVar12 = flags((Internal *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))),
                        in_stack_fffffffffffffc9c), ((uint)*pFVar12 >> 8 & 1) != 0)) {
      pFVar12 = flags((Internal *)
                      CONCAT17(in_stack_fffffffffffffca7,
                               CONCAT16(in_stack_fffffffffffffca6,
                                        CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0
                                                ))),in_stack_fffffffffffffc9c);
      *pFVar12 = (Flags)((uint)*pFVar12 & 0xfffffeff);
      heap<CaDiCaL::elim_more>::push_back
                ((heap<CaDiCaL::elim_more> *)
                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                 (uint)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    }
    Range::iterator::operator++
              ((iterator *)
               CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,
                                 CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
  }
  heap<CaDiCaL::elim_more>::shrink
            ((heap<CaDiCaL::elim_more> *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,
                               CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
  sVar9 = heap<CaDiCaL::elim_more>::size((heap<CaDiCaL::elim_more> *)0xd90d1d);
  local_1a8 = sVar9;
  if (in_RDI->internal != (Internal *)0x0) {
    pIVar15 = in_RDI->internal;
    pcVar16 = (char *)(in_RDI->stats).elimrounds;
    active(in_RDI);
    in_stack_fffffffffffffd40 =
         (Internal *)
         percent((double)CONCAT17(in_stack_fffffffffffffca7,
                                  CONCAT16(in_stack_fffffffffffffca6,
                                           CONCAT24(in_stack_fffffffffffffca4,
                                                    in_stack_fffffffffffffca0))),
                 (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    phase(in_stack_fffffffffffffd40,(char *)pIVar15,0xf1e60c,pcVar16,
          "scheduled %ld variables %.0f%% for elimination",sVar9);
  }
  local_1b0 = &in_RDI->clauses;
  local_1b8._M_current =
       (Clause **)
       std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                 ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
            ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffca7,
                                        CONCAT16(in_stack_fffffffffffffca6,
                                                 CONCAT24(in_stack_fffffffffffffca4,
                                                          in_stack_fffffffffffffca0))),
                            (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)), bVar4
        ) {
    ppCVar10 = __gnu_cxx::
               __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
               ::operator*(&local_1b8);
    if (((*(uint *)&(*ppCVar10)->field_0x8 >> 4 & 1) == 0) &&
       ((*(uint *)&(*ppCVar10)->field_0x8 >> 0xb & 1) == 0)) {
      this_00 = *ppCVar10;
      local_1d8 = (Instantiator *)Clause::begin(this_00);
      in_stack_fffffffffffffd38 = local_1d8;
      pIVar11 = (Instantiator *)Clause::end(this_00);
      for (; local_1d8 != pIVar11;
          local_1d8 = (Instantiator *)
                      ((long)&(local_1d8->candidates).
                              super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4)) {
        bVar4 = active((Internal *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT24(in_stack_fffffffffffffca4,
                                                  in_stack_fffffffffffffca0))),
                       in_stack_fffffffffffffc9c);
        if (bVar4) {
          in_stack_fffffffffffffd20 =
               (Internal *)
               occs((Internal *)
                    CONCAT17(in_stack_fffffffffffffca7,
                             CONCAT16(in_stack_fffffffffffffca6,
                                      CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))
                            ),in_stack_fffffffffffffc9c);
          std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                    ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                     CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                     (value_type *)in_stack_fffffffffffffca8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_1b8);
  }
  lVar1 = (in_RDI->stats).elimres;
  iVar2 = (in_RDI->stats).all.eliminated;
  lVar3 = (in_RDI->stats).irrlits;
  local_208 = 0;
  while( true ) {
    bVar18 = 0;
    if ((in_RDI->unsat & 1U) == 0) {
      in_stack_fffffffffffffd1e =
           terminated_asynchronously
                     (in_stack_fffffffffffffca8,
                      CONCAT13(in_stack_fffffffffffffca7,
                               CONCAT12(in_stack_fffffffffffffca6,in_stack_fffffffffffffca4)));
      bVar18 = 0;
      if ((!(bool)in_stack_fffffffffffffd1e) && (bVar18 = 0, (in_RDI->stats).elimres <= local_30)) {
        in_stack_fffffffffffffd1d =
             heap<CaDiCaL::elim_more>::empty((heap<CaDiCaL::elim_more> *)0xd910aa);
        bVar18 = in_stack_fffffffffffffd1d ^ 0xff;
      }
    }
    if ((bVar18 & 1) == 0) break;
    in_stack_fffffffffffffd18 =
         heap<CaDiCaL::elim_more>::front((heap<CaDiCaL::elim_more> *)0xd910e0);
    heap<CaDiCaL::elim_more>::pop_front
              ((heap<CaDiCaL::elim_more> *)
               CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,
                                 CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
    pFVar12 = flags((Internal *)
                    CONCAT17(in_stack_fffffffffffffca7,
                             CONCAT16(in_stack_fffffffffffffca6,
                                      CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))
                            ),in_stack_fffffffffffffc9c);
    pFVar12->field_0x1 = pFVar12->field_0x1 & 0xfe;
    try_to_eliminate_variable
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
    local_208 = local_208 + 1;
    if ((lVar3 << 1) / 3 + 0x100000 < (in_RDI->stats).garbage.literals) {
      mark_redundant_clauses_with_eliminated_variables_as_garbage(in_stack_fffffffffffffcf0);
      garbage_collection(in_stack_fffffffffffffcc0);
    }
  }
  sVar9 = heap<CaDiCaL::elim_more>::size((heap<CaDiCaL::elim_more> *)0xd911b7);
  *local_10 = (sVar9 != 0 ^ 0xffU) & 1;
  if (in_RDI->internal != (Internal *)0x0) {
    pIVar15 = in_RDI->internal;
    in_stack_fffffffffffffcf0 = (Internal *)(in_RDI->stats).elimrounds;
    pIVar14 = (Internal *)
              percent((double)CONCAT17(in_stack_fffffffffffffca7,
                                       CONCAT16(in_stack_fffffffffffffca6,
                                                CONCAT24(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0))),
                      (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    sVar9 = heap<CaDiCaL::elim_more>::size((heap<CaDiCaL::elim_more> *)0xd91246);
    phase(pIVar14,(char *)pIVar15,0xf1e60c,(char *)in_stack_fffffffffffffcf0,
          "tried to eliminate %ld variables %.0f%% (%zd remain)",local_208,sVar9);
  }
  heap<CaDiCaL::elim_more>::erase
            ((heap<CaDiCaL::elim_more> *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,
                               CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
  Instantiator::Instantiator((Instantiator *)0xd912a0);
  if ((((in_RDI->unsat & 1U) == 0) &&
      (bVar4 = terminated_asynchronously
                         (in_stack_fffffffffffffca8,
                          CONCAT13(in_stack_fffffffffffffca7,
                                   CONCAT12(in_stack_fffffffffffffca6,in_stack_fffffffffffffca4))),
      !bVar4)) && ((in_RDI->opts).instantiate != 0)) {
    collect_instantiation_candidates
              (in_stack_fffffffffffffd20,
               (Instantiator *)
               CONCAT17(bVar18,CONCAT16(in_stack_fffffffffffffd1e,
                                        CONCAT15(in_stack_fffffffffffffd1d,
                                                 CONCAT14(in_stack_fffffffffffffd1c,
                                                          in_stack_fffffffffffffd18)))));
  }
  reset_occs((Internal *)0xd9132d);
  reset_noccs((Internal *)0xd9133c);
  if ((in_RDI->unsat & 1U) == 0) {
    mark_redundant_clauses_with_eliminated_variables_as_garbage(in_stack_fffffffffffffcf0);
  }
  uVar13 = (int)(in_RDI->stats).all.eliminated - (int)iVar2;
  lVar3 = (in_RDI->stats).elimres;
  if (in_RDI->internal != (Internal *)0x0) {
    pIVar15 = in_RDI->internal;
    pcVar16 = (char *)(in_RDI->stats).elimrounds;
    uVar17 = uVar13;
    pIVar14 = (Internal *)
              percent((double)CONCAT17(in_stack_fffffffffffffca7,
                                       CONCAT16(in_stack_fffffffffffffca6,
                                                CONCAT24(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0))),
                      (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    phase(pIVar14,(char *)pIVar15,0xf1e60c,pcVar16,
          "eliminated %d variables %.0f%% in %ld resolutions",(ulong)uVar17,lVar3 - lVar1);
  }
  (in_RDI->last).elim.subsumephases = (in_RDI->stats).subsumephases;
  __timer = (time_t *)0x65;
  report((Internal *)__begin1_2._M_current,__end1_2._M_current._7_1_,(int)__end1_2._M_current);
  time(in_RDI,__timer);
  iVar5 = (in_RDI->internal->opts).profile;
  pIVar15 = s_00;
  if ((in_RDI->internal->profiles).elim.level <= iVar5) {
    stop_profiling(in_RDI->internal,&(in_RDI->internal->profiles).elim,(double)s_00);
  }
  if ((in_RDI->internal->profiles).simplify.level <= iVar5) {
    stop_profiling(in_RDI->internal,&(in_RDI->internal->profiles).simplify,(double)s_00);
  }
  reset_mode(in_RDI,ELIM);
  reset_mode(in_RDI,SIMPLIFY);
  if (((in_RDI->preprocessing & 1U) == 0) && ((in_RDI->lookingahead & 1U) == 0)) {
    if ((in_RDI->internal->profiles).search.level <= iVar5) {
      start_profiling(in_RDI->internal,&(in_RDI->internal->profiles).search,(double)s_00);
    }
    if (((in_RDI->stable & 1U) != 0) && ((in_RDI->internal->profiles).stable.level <= iVar5)) {
      start_profiling(in_RDI->internal,&(in_RDI->internal->profiles).stable,(double)s_00);
    }
    if (((in_RDI->stable & 1U) == 0) && ((in_RDI->internal->profiles).unstable.level <= iVar5)) {
      start_profiling(in_RDI->internal,&(in_RDI->internal->profiles).unstable,(double)s_00);
    }
    set_mode(in_RDI,SEARCH);
  }
  if ((((in_RDI->unsat & 1U) == 0) &&
      (in_stack_fffffffffffffca7 =
            terminated_asynchronously
                      (pIVar15,CONCAT13(in_stack_fffffffffffffca7,
                                        CONCAT12(in_stack_fffffffffffffca6,in_stack_fffffffffffffca4
                                                ))), !(bool)in_stack_fffffffffffffca7)) &&
     (in_stack_fffffffffffffca6 = Instantiator::operator_cast_to_bool((Instantiator *)0xd91703),
     (bool)in_stack_fffffffffffffca6)) {
    instantiate(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  Instantiator::~Instantiator((Instantiator *)0xd91744);
  Eliminator::~Eliminator
            ((Eliminator *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,CONCAT24(in_stack_fffffffffffffca4,uVar13))
                     ));
  return uVar13;
}

Assistant:

int Internal::elim_round (bool &completed, bool &deleted_binary_clause) {

  assert (opts.elim);
  assert (!unsat);

  START_SIMPLIFIER (elim, ELIM);
  stats.elimrounds++;

  last.elim.marked = stats.mark.elim;
  assert (!level);

  int64_t resolution_limit;

  if (opts.elimlimited) {
    int64_t delta = stats.propagations.search;
    delta *= 1e-3 * opts.elimreleff;
    if (delta < opts.elimineff)
      delta = opts.elimineff;
    if (delta > opts.elimaxeff)
      delta = opts.elimaxeff;
    delta = max (delta, (int64_t) 2l * active ());

    PHASE ("elim-round", stats.elimrounds,
           "limit of %" PRId64 " resolutions", delta);

    resolution_limit = stats.elimres + delta;
  } else {
    PHASE ("elim-round", stats.elimrounds, "resolutions unlimited");
    resolution_limit = LONG_MAX;
  }

  init_noccs ();

  // First compute the number of occurrences of each literal and at the same
  // time mark satisfied clauses and update 'elim' flags of variables in
  // clauses with root level assigned literals (both false and true).
  //
  for (const auto &c : clauses) {
    if (c->garbage || c->redundant)
      continue;
    bool satisfied = false, falsified = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0)
        satisfied = true;
      else if (tmp < 0)
        falsified = true;
      else
        assert (active (lit));
    }
    if (satisfied)
      mark_garbage (c); // forces more precise counts
    else {
      for (const auto &lit : *c) {
        if (!active (lit))
          continue;
        if (falsified)
          mark_elim (lit); // simulate unit propagation
        noccs (lit)++;
      }
    }
  }

  init_occs ();

  Eliminator eliminator (this);
  ElimSchedule &schedule = eliminator.schedule;

  // Now find elimination candidates which occurred in clauses removed since
  // the last time we ran bounded variable elimination, which in turned
  // triggered their 'elim' bit to be set.
  //
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (frozen (idx))
      continue;
    if (!flags (idx).elim)
      continue;
    flags (idx).elim = false;
    LOG ("scheduling %d for elimination initially", idx);
    schedule.push_back (idx);
  }

  schedule.shrink ();

#ifndef QUIET
  int64_t scheduled = schedule.size ();
#endif

  PHASE ("elim-round", stats.elimrounds,
         "scheduled %" PRId64 " variables %.0f%% for elimination",
         scheduled, percent (scheduled, active ()));

  // Connect irredundant clauses.
  //
  for (const auto &c : clauses)
    if (!c->garbage && !c->redundant)
      for (const auto &lit : *c)
        if (active (lit))
          occs (lit).push_back (c);

#ifndef QUIET
  const int64_t old_resolutions = stats.elimres;
#endif
  const int old_eliminated = stats.all.eliminated;
  const int old_fixed = stats.all.fixed;

  // Limit on garbage literals during variable elimination. If the limit is
  // hit a garbage collection is performed.
  //
  const int64_t garbage_limit = (2 * stats.irrlits / 3) + (1 << 20);

  // Main loops tries to eliminate variables according to the schedule. The
  // schedule is updated dynamically and variables are potentially
  // rescheduled to be tried again if they occur in a removed clause.
  //
#ifndef QUIET
  int64_t tried = 0;
#endif
  while (!unsat && !terminated_asynchronously () &&
         stats.elimres <= resolution_limit && !schedule.empty ()) {
    int idx = schedule.front ();
    schedule.pop_front ();
    flags (idx).elim = false;
    try_to_eliminate_variable (eliminator, idx, deleted_binary_clause);
#ifndef QUIET
    tried++;
#endif
    if (stats.garbage.literals <= garbage_limit)
      continue;
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();
    garbage_collection ();
  }

  // If the schedule is empty all variables have been tried (even
  // rescheduled ones).  Otherwise asynchronous termination happened or we
  // ran into the resolution limit (or derived unsatisfiability).
  //
  completed = !schedule.size ();

  PHASE ("elim-round", stats.elimrounds,
         "tried to eliminate %" PRId64 " variables %.0f%% (%zd remain)",
         tried, percent (tried, scheduled), schedule.size ());

  schedule.erase ();

  // Collect potential literal clause instantiation pairs, which needs full
  // occurrence lists and thus we have it here before resetting them.
  //
  Instantiator instantiator;
  if (!unsat && !terminated_asynchronously () && opts.instantiate)
    collect_instantiation_candidates (instantiator);

  reset_occs ();
  reset_noccs ();

  // Mark all redundant clauses with eliminated variables as garbage.
  //
  if (!unsat)
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();

  int eliminated = stats.all.eliminated - old_eliminated;
#ifndef QUIET
  int64_t resolutions = stats.elimres - old_resolutions;
  PHASE ("elim-round", stats.elimrounds,
         "eliminated %d variables %.0f%% in %" PRId64 " resolutions",
         eliminated, percent (eliminated, scheduled), resolutions);
#endif

  last.elim.subsumephases = stats.subsumephases;
  const int units = stats.all.fixed - old_fixed;
  report ('e', !opts.reportall && !(eliminated + units));
  STOP_SIMPLIFIER (elim, ELIM);

  if (!unsat && !terminated_asynchronously () &&
      instantiator) // Do we have candidate pairs?
    instantiate (instantiator);

  return eliminated; // non-zero if successful
}